

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * find_D_Sym_internal(D_Scope *cur,char *name,int len,uint h)

{
  D_SymHash *pDVar1;
  int iVar2;
  D_Sym *pDVar3;
  D_Sym **ppDVar4;
  
  do {
    if (cur == (D_Scope *)0x0) {
      return (D_Sym *)0x0;
    }
    pDVar1 = cur->hash;
    if (pDVar1 == (D_SymHash *)0x0) {
      ppDVar4 = &cur->ll;
    }
    else {
      ppDVar4 = (pDVar1->syms).v + (ulong)h % (ulong)(pDVar1->syms).n;
    }
    for (pDVar3 = *ppDVar4; pDVar3 != (D_Sym *)0x0; pDVar3 = pDVar3->next) {
      if (((pDVar3->hash == h) && (pDVar3->len == len)) &&
         (iVar2 = strncmp(pDVar3->name,name,(long)len), iVar2 == 0)) {
        return pDVar3;
      }
    }
    if ((cur->dynamic != (D_Scope *)0x0) &&
       (pDVar3 = find_D_Sym_in_Scope_internal(cur->dynamic,name,len,h), pDVar3 != (D_Sym *)0x0)) {
      return pDVar3;
    }
    cur = cur->search;
    if (cur == (D_Scope *)0x0) {
      return (D_Sym *)0x0;
    }
  } while( true );
}

Assistant:

static D_Sym *find_D_Sym_internal(D_Scope *cur, char *name, int len, uint h) {
  D_Sym *ll;
  if (!cur) return NULL;
  if (cur->hash)
    ll = cur->hash->syms.v[h % cur->hash->syms.n];
  else
    ll = cur->ll;
  while (ll) {
    if (ll->hash == h && ll->len == len && !strncmp(ll->name, name, len)) break;
    ll = ll->next;
  }
  if (!ll) {
    if (cur->dynamic)
      if ((ll = find_D_Sym_in_Scope_internal(cur->dynamic, name, len, h))) return ll;
    if (cur->search) return find_D_Sym_internal(cur->search, name, len, h);
    return ll;
  }
  return ll;
}